

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commands.h
# Opt level: O0

void LabelMission(int id)

{
  int iVar1;
  int iVar2;
  int id_local;
  
  EnterCriticalSection(&MissionFilesCS);
  if ((bMissionRunning == 0) && (missionfile == (FILE *)0x0)) {
    printf("Cannot use label outside a mission file.\n");
    LeaveCriticalSection(&MissionFilesCS);
  }
  else if ((id < 0) || (0x3ff < id)) {
    printf("Invalid parameter.\n");
    LeaveCriticalSection(&MissionFilesCS);
  }
  else {
    if (labels[id] < 1) {
      iVar2 = ftellline(missionfile);
      labels[id] = iVar2;
      if (labels[id] < 1) {
        printf("File error.\n");
      }
    }
    else {
      iVar2 = labels[id];
      iVar1 = ftellline(missionfile);
      if (iVar2 != iVar1) {
        printf("Label %d already exists.\n",(ulong)(uint)id);
      }
    }
    LeaveCriticalSection(&MissionFilesCS);
    SetCurrentLabelEx("log/CurLbl.txt",id);
  }
  return;
}

Assistant:

inline void LabelMission(int id)
{
	EnterCriticalSection(&MissionFilesCS);
	if ((!bMissionRunning)&&(!missionfile))
	{
		printf("Cannot use label outside a mission file.\n");
		LeaveCriticalSection(&MissionFilesCS);
		return;
	}
	if ((id < 0)||(id >= MAX_NB_LABELS))
	{
		printf("Invalid parameter.\n");
		LeaveCriticalSection(&MissionFilesCS);
		return;
	}
	// Labels are reset every time a new mission file is opened.
	if (labels[id] > 0) 
	{
		if (labels[id] != ftellline(missionfile))
		{
			printf("Label %d already exists.\n", id);
		}
	}
	else 
	{
		labels[id] = ftellline(missionfile);
		if (labels[id] <= 0)
		{
			printf("File error.\n");
		}
	}
	LeaveCriticalSection(&MissionFilesCS);
	SetCurrentLabelEx(LOG_FOLDER"CurLbl.txt", id);
}